

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O0

MaybeResult<wasm::Ok> *
wasm::WATParser::blockinstr<wasm::WATParser::ParseDefsCtx>
          (MaybeResult<wasm::Ok> *__return_storage_ptr__,ParseDefsCtx *ctx,
          vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
          *annotations)

{
  bool bVar1;
  vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
  *annotations_local;
  ParseDefsCtx *ctx_local;
  MaybeResult<wasm::Ok> *i;
  
  foldedBlockinstr<wasm::WATParser::ParseDefsCtx>(__return_storage_ptr__,ctx,annotations);
  bVar1 = wasm::MaybeResult::operator_cast_to_bool((MaybeResult *)__return_storage_ptr__);
  if (!bVar1) {
    MaybeResult<wasm::Ok>::~MaybeResult(__return_storage_ptr__);
    unfoldedBlockinstr<wasm::WATParser::ParseDefsCtx>(__return_storage_ptr__,ctx,annotations);
    bVar1 = wasm::MaybeResult::operator_cast_to_bool((MaybeResult *)__return_storage_ptr__);
    if (!bVar1) {
      MaybeResult<wasm::Ok>::~MaybeResult(__return_storage_ptr__);
      MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

MaybeResult<> blockinstr(Ctx& ctx, const std::vector<Annotation>& annotations) {
  if (auto i = foldedBlockinstr(ctx, annotations)) {
    return i;
  }
  if (auto i = unfoldedBlockinstr(ctx, annotations)) {
    return i;
  }
  return {};
}